

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O3

void ZopfliLZ77GetHistogram
               (ZopfliLZ77Store *lz77,size_t lstart,size_t lend,size_t *ll_counts,size_t *d_counts)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t d_counts2 [32];
  size_t ll_counts2 [288];
  size_t local_a28 [320];
  
  if (lend < lstart + 0x360) {
    memset(ll_counts,0,0x900);
    memset(d_counts,0,0x100);
    if (lstart < lend) {
      puVar1 = lz77->dists;
      puVar2 = lz77->ll_symbol;
      do {
        ll_counts[puVar2[lstart]] = ll_counts[puVar2[lstart]] + 1;
        if (puVar1[lstart] != 0) {
          d_counts[lz77->d_symbol[lstart]] = d_counts[lz77->d_symbol[lstart]] + 1;
        }
        lstart = lstart + 1;
      } while (lend != lstart);
    }
  }
  else {
    ZopfliLZ77GetHistogramAt(lz77,lend - 1,ll_counts,d_counts);
    if (lstart != 0) {
      ZopfliLZ77GetHistogramAt(lz77,lstart - 1,local_a28 + 0x20,local_a28);
      lVar5 = 0;
      do {
        sVar3 = (ll_counts + lVar5)[1];
        sVar4 = local_a28[lVar5 + 0x21];
        ll_counts[lVar5] = ll_counts[lVar5] - local_a28[lVar5 + 0x20];
        (ll_counts + lVar5)[1] = sVar3 - sVar4;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 0x120);
      lVar5 = 0;
      do {
        sVar3 = (d_counts + lVar5)[1];
        sVar4 = local_a28[lVar5 + 1];
        d_counts[lVar5] = d_counts[lVar5] - local_a28[lVar5];
        (d_counts + lVar5)[1] = sVar3 - sVar4;
        lVar5 = lVar5 + 2;
      } while (lVar5 != 0x20);
    }
  }
  return;
}

Assistant:

void ZopfliLZ77GetHistogram(const ZopfliLZ77Store* lz77,
                           size_t lstart, size_t lend,
                           size_t* ll_counts, size_t* d_counts) {
  size_t i;
  if (lstart + ZOPFLI_NUM_LL * 3 > lend) {
    memset(ll_counts, 0, sizeof(*ll_counts) * ZOPFLI_NUM_LL);
    memset(d_counts, 0, sizeof(*d_counts) * ZOPFLI_NUM_D);
    for (i = lstart; i < lend; i++) {
      ll_counts[lz77->ll_symbol[i]]++;
      if (lz77->dists[i] != 0) d_counts[lz77->d_symbol[i]]++;
    }
  } else {
    /* Subtract the cumulative histograms at the end and the start to get the
    histogram for this range. */
    ZopfliLZ77GetHistogramAt(lz77, lend - 1, ll_counts, d_counts);
    if (lstart > 0) {
      size_t ll_counts2[ZOPFLI_NUM_LL];
      size_t d_counts2[ZOPFLI_NUM_D];
      ZopfliLZ77GetHistogramAt(lz77, lstart - 1, ll_counts2, d_counts2);

      for (i = 0; i < ZOPFLI_NUM_LL; i++) {
        ll_counts[i] -= ll_counts2[i];
      }
      for (i = 0; i < ZOPFLI_NUM_D; i++) {
        d_counts[i] -= d_counts2[i];
      }
    }
  }
}